

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int serialGet7(uchar *buf,Mem *pMem)

{
  byte bVar1;
  u16 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  bVar1 = buf[1];
  uVar4 = (uint)bVar1 << 0x10 | (uint)*buf << 0x18;
  uVar5 = (uint)(ushort)(*(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8);
  uVar7 = (uint)buf[5] << 0x10 | (uint)buf[4] << 0x18;
  uVar6 = (ulong)(ushort)(*(ushort *)(buf + 6) << 8 | *(ushort *)(buf + 6) >> 8);
  (pMem->u).i = uVar6 | CONCAT44(uVar5 | uVar4,uVar7);
  bVar8 = (~uVar4 & 0x7ff00000) == 0;
  bVar3 = ((uint)bVar1 << 0x10 & 0xfffff) != 0;
  uVar2 = 8;
  if ((uVar6 != 0 || (uVar7 != 0 || (uVar5 != 0 || bVar3))) && bVar8) {
    uVar2 = 1;
  }
  pMem->flags = uVar2;
  return (int)((uVar6 != 0 || (uVar7 != 0 || (uVar5 != 0 || bVar3))) && bVar8);
}

Assistant:

static int serialGet7(
  const unsigned char *buf,     /* Buffer to deserialize from */
  Mem *pMem                     /* Memory cell to write value into */
){
  u64 x = FOUR_BYTE_UINT(buf);
  u32 y = FOUR_BYTE_UINT(buf+4);
  x = (x<<32) + y;
  assert( sizeof(x)==8 && sizeof(pMem->u.r)==8 );
  swapMixedEndianFloat(x);
  memcpy(&pMem->u.r, &x, sizeof(x));
  if( IsNaN(x) ){
    pMem->flags = MEM_Null;
    return 1;
  }
  pMem->flags = MEM_Real;
  return 0;
}